

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_unsigned.cpp
# Opt level: O0

bool sc_dt::operator==(sc_unsigned *u,long v)

{
  small_type sVar1;
  int iVar2;
  long in_RSI;
  small_type in_EDI;
  int unaff_retaddr;
  sc_digit *in_stack_00000008;
  small_type in_stack_00000010;
  small_type in_stack_00000018;
  sc_digit vd [3];
  small_type vs;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  unsigned_long in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  small_type in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  if (in_RSI < 0) {
    local_1 = false;
  }
  else {
    sVar1 = get_sign<long>((long *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    from_uint<unsigned_long>
              (in_stack_ffffffffffffffd4,
               (sc_digit *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               in_stack_ffffffffffffffc0);
    iVar2 = compare_unsigned(in_EDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                             (sc_digit *)CONCAT44(sVar1,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,unaff_retaddr,
                             in_stack_00000008,in_stack_00000010,in_stack_00000018);
    if (iVar2 == 0) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool
operator==(const sc_unsigned& u, long v)
{
  if (v < 0)
    return false;
  CONVERT_LONG(v);
  if (compare_unsigned(u.sgn, u.nbits, u.ndigits, u.digit,
                       vs, BITS_PER_ULONG, DIGITS_PER_ULONG, vd) != 0)
    return false;
  return true;
}